

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O3

bool __thiscall cmCTestGIT::LoadModifications(cmCTestGIT *this)

{
  pointer pcVar1;
  Change *c;
  pointer pCVar2;
  char *git_update_index [4];
  char *git_diff_index [6];
  OutputLogger err;
  OutputLogger ui_err;
  OutputLogger ui_out;
  DiffParser out;
  pointer local_1b8;
  char *local_1b0;
  char *local_1a8;
  undefined8 local_1a0;
  pointer local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  undefined8 local_170;
  OutputLogger local_168;
  OutputLogger local_128;
  OutputLogger local_e8;
  DiffParser local_a8;
  
  pcVar1 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool._M_dataplus._M_p;
  local_1b0 = "update-index";
  local_1a8 = "--refresh";
  local_1a0 = 0;
  local_1b8 = pcVar1;
  cmProcessTools::OutputLogger::OutputLogger
            (&local_e8,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"ui-out> ");
  cmProcessTools::OutputLogger::OutputLogger
            (&local_128,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"ui-err> ");
  cmCTestVC::RunChild((cmCTestVC *)this,&local_1b8,(OutputParser *)&local_e8,
                      (OutputParser *)&local_128,(char *)0x0,UTF8);
  local_190 = "diff-index";
  local_188 = "-z";
  local_180 = "HEAD";
  local_178 = "--";
  local_170 = 0;
  local_198 = pcVar1;
  DiffParser::DiffParser(&local_a8,this,"di-out> ");
  cmProcessTools::OutputLogger::OutputLogger
            (&local_168,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"di-err> ");
  cmCTestVC::RunChild((cmCTestVC *)this,&local_198,(OutputParser *)&local_a8,
                      (OutputParser *)&local_168,(char *)0x0,UTF8);
  for (pCVar2 = local_a8.Changes.
                super__Vector_base<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pCVar2 != local_a8.Changes.
                super__Vector_base<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>
                ._M_impl.super__Vector_impl_data._M_finish; pCVar2 = pCVar2 + 1) {
    (*(this->super_cmCTestGlobalVC).super_cmCTestVC._vptr_cmCTestVC[10])(this,1,&pCVar2->Path);
  }
  local_168.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__LineParser_0094e948;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168.super_LineParser.Line._M_dataplus._M_p !=
      &local_168.super_LineParser.Line.field_2) {
    operator_delete(local_168.super_LineParser.Line._M_dataplus._M_p,
                    local_168.super_LineParser.Line.field_2._M_allocated_capacity + 1);
  }
  local_a8.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__DiffParser_0094bb20;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.CurChange.Path._M_dataplus._M_p != &local_a8.CurChange.Path.field_2) {
    operator_delete(local_a8.CurChange.Path._M_dataplus._M_p,
                    local_a8.CurChange.Path.field_2._M_allocated_capacity + 1);
  }
  std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>::~vector
            (&local_a8.Changes);
  local_a8.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__LineParser_0094e948;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.super_LineParser.Line._M_dataplus._M_p != &local_a8.super_LineParser.Line.field_2)
  {
    operator_delete(local_a8.super_LineParser.Line._M_dataplus._M_p,
                    local_a8.super_LineParser.Line.field_2._M_allocated_capacity + 1);
  }
  local_128.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__LineParser_0094e948;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128.super_LineParser.Line._M_dataplus._M_p !=
      &local_128.super_LineParser.Line.field_2) {
    operator_delete(local_128.super_LineParser.Line._M_dataplus._M_p,
                    local_128.super_LineParser.Line.field_2._M_allocated_capacity + 1);
  }
  local_e8.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__LineParser_0094e948;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.super_LineParser.Line._M_dataplus._M_p != &local_e8.super_LineParser.Line.field_2)
  {
    operator_delete(local_e8.super_LineParser.Line._M_dataplus._M_p,
                    local_e8.super_LineParser.Line.field_2._M_allocated_capacity + 1);
  }
  return true;
}

Assistant:

bool cmCTestGIT::LoadModifications()
{
  const char* git = this->CommandLineTool.c_str();

  // Use 'git update-index' to refresh the index w.r.t. the work tree.
  const char* git_update_index[] = { git, "update-index", "--refresh",
                                     nullptr };
  OutputLogger ui_out(this->Log, "ui-out> ");
  OutputLogger ui_err(this->Log, "ui-err> ");
  this->RunChild(git_update_index, &ui_out, &ui_err, nullptr,
                 cmProcessOutput::UTF8);

  // Use 'git diff-index' to get modified files.
  const char* git_diff_index[] = { git,    "diff-index", "-z",
                                   "HEAD", "--",         nullptr };
  DiffParser out(this, "di-out> ");
  OutputLogger err(this->Log, "di-err> ");
  this->RunChild(git_diff_index, &out, &err, nullptr, cmProcessOutput::UTF8);

  for (Change const& c : out.Changes) {
    this->DoModification(PathModified, c.Path);
  }
  return true;
}